

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O3

uint Cudd_ApaIntDivision(int digits,DdApaNumber dividend,uint divisor,DdApaNumber quotient)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  if (0 < digits) {
    uVar2 = 0;
    uVar1 = 0;
    do {
      dVar3 = (double)(uVar1 & 0xffffffff) * 4294967296.0 + (double)dividend[uVar2];
      uVar1 = (ulong)(dVar3 / (double)divisor);
      quotient[uVar2] = (DdApaDigit)uVar1;
      uVar1 = (ulong)(dVar3 - (double)(uVar1 & 0xffffffff) * (double)divisor);
      uVar2 = uVar2 + 1;
    } while ((uint)digits != uVar2);
    return (uint)uVar1;
  }
  return 0;
}

Assistant:

unsigned int
Cudd_ApaIntDivision(
  int  digits,
  DdApaNumber dividend,
  unsigned int divisor,
  DdApaNumber quotient)
{
    int i;
    double partial;
    unsigned int remainder = 0;
    double ddiv = (double) divisor;

    for (i = 0; i < digits; i++) {
        partial = (double) remainder * DD_APA_BASE + dividend[i];
        quotient[i] = (DdApaDigit) (partial / ddiv);
        remainder = (unsigned int) (partial - ((double)quotient[i] * ddiv));
    }

    return(remainder);

}